

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::timeout_handler::set_timeout
          (timeout_handler *this,int completion_timeout,int read_timeout)

{
  int iVar1;
  int iVar2;
  service_type *psVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  _Bind<void_(libtorrent::aux::timeout_handler::*(std::shared_ptr<libtorrent::aux::timeout_handler>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_38;
  
  this->m_completion_timeout = completion_timeout;
  this->m_read_timeout = read_timeout;
  lVar4 = ::std::chrono::_V2::system_clock::now();
  (this->m_read_time).__d.__r = lVar4;
  (this->m_start_time).__d.__r = lVar4;
  if (this->m_abort == false) {
    iVar1 = this->m_read_timeout;
    iVar5 = 0;
    if (0 < iVar1) {
      iVar5 = iVar1;
    }
    iVar2 = this->m_completion_timeout;
    iVar6 = iVar2;
    if (iVar5 < iVar2) {
      iVar6 = iVar5;
    }
    if (iVar1 < 1) {
      iVar6 = iVar2;
    }
    if (iVar2 < 1) {
      iVar6 = iVar5;
    }
    if ((this->m_timeout).impl_.implementation_.might_have_pending_waits == true) {
      psVar3 = (this->m_timeout).impl_.service_;
      boost::asio::detail::epoll_reactor::
      cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                (psVar3->scheduler_,&psVar3->timer_queue_,
                 &(this->m_timeout).impl_.implementation_.timer_data,0xffffffffffffffff);
      (this->m_timeout).impl_.implementation_.might_have_pending_waits = false;
    }
    (this->m_timeout).impl_.implementation_.expiry.__d.__r = (long)iVar6 * 1000000000 + lVar4;
    ::std::__shared_ptr<libtorrent::aux::timeout_handler,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::timeout_handler,void>
              ((__shared_ptr<libtorrent::aux::timeout_handler,(__gnu_cxx::_Lock_policy)2> *)
               &local_48,
               (__weak_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::timeout_handler>);
    local_38._M_f = (offset_in_timeout_handler_to_subr)timeout_callback;
    local_38._8_8_ = 0;
    local_38._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::timeout_handler>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::timeout_handler>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48;
    local_38._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::timeout_handler>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::timeout_handler>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Stack_40;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::asio::detail::
    deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
    ::
    async_wait<std::_Bind<void(libtorrent::aux::timeout_handler::*(std::shared_ptr<libtorrent::aux::timeout_handler>,std::_Placeholder<1>))(boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ((deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                *)(this->m_timeout).impl_.service_,&(this->m_timeout).impl_.implementation_,
               &local_38,&(this->m_timeout).impl_.executor_);
    if (local_38._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::timeout_handler>,_std::_Placeholder<1>_>
        .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::timeout_handler>,_false>.
        _M_head_impl.
        super___shared_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38._M_bound_args.
                 super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::timeout_handler>,_std::_Placeholder<1>_>
                 .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::timeout_handler>,_false>.
                 _M_head_impl.
                 super___shared_ptr<libtorrent::aux::timeout_handler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  return;
}

Assistant:

void timeout_handler::set_timeout(int completion_timeout, int read_timeout)
	{
		m_completion_timeout = completion_timeout;
		m_read_timeout = read_timeout;
		m_start_time = m_read_time = clock_type::now();

		TORRENT_ASSERT(completion_timeout > 0 || read_timeout > 0);

		if (m_abort) return;

		int timeout = 0;
		if (m_read_timeout > 0) timeout = m_read_timeout;
		if (m_completion_timeout > 0)
		{
			timeout = timeout == 0
				? m_completion_timeout
				: std::min(m_completion_timeout, timeout);
		}

		ADD_OUTSTANDING_ASYNC("timeout_handler::timeout_callback");
		m_timeout.expires_at(m_read_time + seconds(timeout));
		m_timeout.async_wait(std::bind(
			&timeout_handler::timeout_callback, shared_from_this(), _1));
#if TORRENT_USE_ASSERTS
		++m_outstanding_timer_wait;
#endif
	}